

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<ValueType,_bool> * __thiscall
Memory::AllocateArray<Memory::ArenaAllocator,JsUtil::SimpleDictionaryEntry<ValueType,bool>,false>
          (Memory *this,ArenaAllocator *allocator,offset_in_ArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  long lVar1;
  SimpleDictionaryEntry<ValueType,_bool> *pSVar2;
  long lVar3;
  
  if (count == 0) {
    pSVar2 = (SimpleDictionaryEntry<ValueType,_bool> *)0x8;
  }
  else {
    pSVar2 = (SimpleDictionaryEntry<ValueType,_bool> *)
             new__<Memory::ArenaAllocator>
                       (-(ulong)(count >> 0x3d != 0) | count * 8,(ArenaAllocator *)this,
                        (offset_in_ArenaAllocator_to_subr)allocator);
    lVar3 = 2;
    do {
      ValueType::ValueType
                ((ValueType *)
                 (&(pSVar2->
                   super_DefaultHashedEntry<ValueType,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   ).super_KeyValueEntry<ValueType,_bool>.
                   super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<ValueType,_bool>_>
                   .super_KeyValueEntryDataLayout1<ValueType,_bool>.value + lVar3));
      lVar1 = count * -8 + lVar3;
      lVar3 = lVar3 + 8;
    } while (lVar1 != -6);
  }
  return pSVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}